

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int __thiscall AActor::CallDoSpecialDamage(AActor *this,AActor *target,int damage,FName *damagetype)

{
  VMFunction *func;
  PNativeStruct *pPVar1;
  int iVar2;
  DObject *p;
  PFunction *pPVar3;
  PClass *pPVar4;
  FString *this_00;
  long lVar5;
  undefined8 *in_FS_OFFSET;
  int retval;
  VMReturn ret;
  VMValue params [4];
  int local_84;
  VMReturn local_80;
  int local_6c;
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  int local_48;
  undefined1 local_3c;
  FString local_38;
  char local_2c [4];
  undefined4 extraout_var;
  
  if (CallDoSpecialDamage::VIndex == 0xffffffff) {
    pPVar1 = &(RegistrationInfo.MyClass)->super_PNativeStruct;
    iVar2 = FName::NameManager::FindName(&FName::NameData,"DoSpecialDamage",false);
    local_68.i = iVar2;
    p = (DObject *)
        PSymbolTable::FindSymbol
                  (&(pPVar1->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.Symbols
                   ,(FName *)&local_68.field_1,false);
    pPVar3 = dyn_cast<PFunction>(p);
    if (pPVar3 == (PFunction *)0x0) {
      __assert_fail("sym != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/virtual.h"
                    ,5,"unsigned int GetVirtualIndex(PClass *, const char *)");
    }
    CallDoSpecialDamage::VIndex = ((pPVar3->Variants).Array)->Implementation->VirtualIndex;
    if (CallDoSpecialDamage::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ba8,"int AActor::CallDoSpecialDamage(AActor *, int, FName)");
    }
  }
  pPVar4 = (this->super_DThinker).super_DObject.Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
    (this->super_DThinker).super_DObject.Class = pPVar4;
  }
  if ((CallDoSpecialDamage::VIndex < (pPVar4->Virtuals).Count) &&
     (func = (pPVar4->Virtuals).Array[CallDoSpecialDamage::VIndex], func != (VMFunction *)0x0)) {
    local_68.field_1.atag = 1;
    local_68.field_3.Type = '\x03';
    local_50 = 1;
    local_4c = 3;
    local_3c = 0;
    local_38.Chars._0_4_ = damagetype->Index;
    local_2c[0] = 0;
    local_80.Location = &local_84;
    local_80.TagOfs = 0;
    local_80.RegType = '\0';
    local_68.field_1.a = this;
    local_58 = target;
    local_48 = damage;
    GlobalVMStack::__tls_init();
    VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,func,(VMValue *)&local_68.field_1,4,&local_80,1
                       ,(VMException **)0x0);
    lVar5 = -0x40;
    this_00 = &local_38;
    do {
      if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
        FString::~FString(this_00);
      }
      this_00 = this_00 + -2;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0);
  }
  else {
    local_6c = damagetype->Index;
    local_84 = (*(this->super_DThinker).super_DObject._vptr_DObject[0x10])
                         (this,target,(ulong)(uint)damage);
  }
  return local_84;
}

Assistant:

int AActor::CallDoSpecialDamage(AActor *target, int damage, FName damagetype)
{
	IFVIRTUAL(AActor, DoSpecialDamage)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[4] = { (DObject*)this, (DObject*)target, damage, damagetype.GetIndex() };
		VMReturn ret;
		int retval;
		ret.IntAt(&retval);
		GlobalVMStack.Call(func, params, 4, &ret, 1, nullptr);
		return retval;
	}
	else return DoSpecialDamage(target, damage, damagetype);

}